

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::mark_location_as_used_by_shader
          (CompilerMSL *this,uint32_t location,SPIRType *type,StorageClass storage)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  __hashtable *__h_2;
  __hashtable *__h;
  ulong uVar7;
  __node_gen_type __node_gen;
  uint32_t local_50;
  uint32_t local_4c;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_48;
  int local_3c;
  CompilerMSL *local_38;
  
  if (storage == StorageClassInput) {
    local_50 = location;
    bVar2 = Compiler::is_array((Compiler *)this,type);
    if (bVar2) {
      if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
        iVar4 = 1;
      }
      else {
        uVar7 = 0;
        iVar4 = 1;
        do {
          uVar3 = CompilerGLSL::to_array_size_literal
                            (&this->super_CompilerGLSL,type,(uint32_t)uVar7);
          iVar4 = iVar4 * uVar3;
          uVar7 = (ulong)((uint32_t)uVar7 + 1);
        } while (uVar7 < (type->array).super_VectorView<unsigned_int>.buffer_size);
      }
      if (iVar4 != 0) {
        puVar1 = &this->inputs_in_use;
        iVar5 = 0;
        local_3c = iVar4;
        local_38 = this;
        do {
          bVar2 = Compiler::is_matrix((Compiler *)local_38,type);
          if (bVar2) {
            if (type->columns != 0) {
              uVar6 = 0;
              do {
                local_4c = local_50;
                local_50 = local_50 + 1;
                local_48 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)puVar1;
                ::std::
                _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                          ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)puVar1,&local_4c,&local_48);
                uVar6 = uVar6 + 1;
              } while (uVar6 < type->columns);
            }
          }
          else {
            local_4c = local_50;
            local_50 = local_50 + 1;
            local_48 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)puVar1;
            ::std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)puVar1,&local_4c,&local_48);
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 != local_3c);
      }
    }
    else {
      bVar2 = Compiler::is_matrix((Compiler *)this,type);
      if (bVar2) {
        if (type->columns != 0) {
          uVar6 = 0;
          do {
            local_4c = local_50 + uVar6;
            local_48 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&this->inputs_in_use;
            ::std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&this->inputs_in_use,&local_4c,&local_48);
            uVar6 = uVar6 + 1;
          } while (uVar6 < type->columns);
        }
      }
      else {
        local_48 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this->inputs_in_use;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  (local_48,&local_50);
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::mark_location_as_used_by_shader(uint32_t location, const SPIRType &type, StorageClass storage)
{
	if (storage != StorageClassInput)
		return;
	if (is_array(type))
	{
		uint32_t dim = 1;
		for (uint32_t i = 0; i < type.array.size(); i++)
			dim *= to_array_size_literal(type, i);
		for (uint32_t i = 0; i < dim; i++)
		{
			if (is_matrix(type))
			{
				for (uint32_t j = 0; j < type.columns; j++)
					inputs_in_use.insert(location++);
			}
			else
				inputs_in_use.insert(location++);
		}
	}
	else if (is_matrix(type))
	{
		for (uint32_t i = 0; i < type.columns; i++)
			inputs_in_use.insert(location + i);
	}
	else
		inputs_in_use.insert(location);
}